

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void determine_constants_arrays(Context *ctx)

{
  uint uVar1;
  ConstantsList *pCVar2;
  ConstantsList *pCVar3;
  int *piVar4;
  void *pvVar5;
  MOJOSHADER_malloc p_Var6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  VariableList *pVVar10;
  ConstantsList **ppCVar11;
  ConstantsList *tmp;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ConstantsList *pCVar16;
  ulong uVar17;
  long *plVar18;
  ulong uVar19;
  long alStack_50 [3];
  int local_34;
  
  if (ctx->determined_constants_arrays == 0) {
    ctx->determined_constants_arrays = 1;
    uVar1 = ctx->constant_count;
    uVar9 = (ulong)uVar1;
    if (1 < (int)uVar1) {
      lVar7 = -(uVar9 * 8 + 0x17 & 0xfffffffffffffff0);
      plVar18 = (long *)((long)alStack_50 + lVar7 + 8);
      ppCVar11 = &ctx->constants;
      uVar12 = 0;
      do {
        pCVar2 = *ppCVar11;
        if (pCVar2 == (ConstantsList *)0x0) {
          failf(ctx,"%s","BUG: mismatched constant list and count");
          return;
        }
        plVar18[uVar12] = (long)pCVar2;
        ppCVar11 = &pCVar2->next;
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
      plVar18[uVar9] = 0;
      do {
        bVar8 = true;
        uVar12 = 0;
        lVar13 = *plVar18;
        do {
          lVar14 = *(long *)((long)alStack_50 + uVar12 * 8 + lVar7 + 0x10);
          if (*(int *)(lVar14 + 4) < *(int *)(lVar13 + 4)) {
            plVar18[uVar12] = lVar14;
            *(long *)((long)alStack_50 + uVar12 * 8 + lVar7 + 0x10) = lVar13;
            bVar8 = false;
            lVar14 = lVar13;
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar14;
        } while (uVar1 - 1 != uVar12);
      } while (!bVar8);
      pCVar2 = (ConstantsList *)*plVar18;
      uVar12 = 0;
      pCVar16 = pCVar2;
      do {
        pCVar3 = *(ConstantsList **)((long)alStack_50 + uVar12 * 8 + lVar7 + 0x10);
        uVar12 = uVar12 + 1;
        pCVar16->next = pCVar3;
        pCVar16 = pCVar3;
      } while (uVar9 != uVar12);
      ctx->constants = pCVar2;
      uVar9 = (ulong)(uVar1 + 1);
      uVar19 = 0xffffffff;
      uVar17 = 0;
      local_34 = 0;
      uVar12 = 0xffffffff;
      alStack_50[2] = uVar9;
      do {
        piVar4 = (int *)plVar18[uVar17];
        iVar15 = (int)uVar12;
        if (piVar4 == (int *)0x0) {
          if (iVar15 == -1 || local_34 < 1) goto LAB_00120464;
LAB_00120470:
          pvVar5 = ctx->malloc_data;
          p_Var6 = ctx->malloc;
          *(undefined8 *)((long)alStack_50 + lVar7) = 0x120480;
          pVVar10 = (VariableList *)(*p_Var6)(0x28,pvVar5);
          if (pVVar10 == (VariableList *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
            return;
          }
          pVVar10->type = MOJOSHADER_UNIFORM_FLOAT;
          pCVar2 = (ConstantsList *)plVar18[iVar15];
          iVar15 = (pCVar2->constant).index;
          pVVar10->index = iVar15;
          pVVar10->count = (*(int *)(plVar18[(int)uVar19] + 4) - iVar15) + 1;
          pVVar10->constant = pCVar2;
          pVVar10->used = 0;
          pVVar10->emit_position = -1;
          pVVar10->next = ctx->variables;
          ctx->variables = pVVar10;
          uVar12 = uVar17 & 0xffffffff;
          uVar19 = uVar17 & 0xffffffff;
          uVar9 = alStack_50[2];
        }
        else if (*piVar4 == 0) {
          if (iVar15 == -1) {
LAB_00120464:
            uVar12 = uVar17 & 0xffffffff;
          }
          else {
            if (piVar4[1] != *(int *)(plVar18[(int)uVar19] + 4) + 1) {
              if (0 < local_34) goto LAB_00120470;
              goto LAB_00120464;
            }
            local_34 = local_34 + 1;
          }
          uVar19 = uVar17 & 0xffffffff;
        }
        uVar17 = uVar17 + 1;
      } while (uVar9 != uVar17);
    }
  }
  return;
}

Assistant:

static void determine_constants_arrays(Context *ctx)
{
    // Only process this stuff once. This is called after all DEF* opcodes
    //  could have been parsed.
    if (ctx->determined_constants_arrays)
        return;

    ctx->determined_constants_arrays = 1;

    if (ctx->constant_count <= 1)
        return;  // nothing to sort or group.

    // Sort the linked list into an array for easier tapdancing...
    ConstantsList **array = (ConstantsList **) alloca(sizeof (ConstantsList *) * (ctx->constant_count + 1));
    ConstantsList *item = ctx->constants;
    int i;

    for (i = 0; i < ctx->constant_count; i++)
    {
        if (item == NULL)
        {
            fail(ctx, "BUG: mismatched constant list and count");
            return;
        } // if

        array[i] = item;
        item = item->next;
    } // for

    array[ctx->constant_count] = NULL;

    // bubble sort ftw.
    int sorted;
    do
    {
        sorted = 1;
        for (i = 0; i < ctx->constant_count-1; i++)
        {
            if (array[i]->constant.index > array[i+1]->constant.index)
            {
                ConstantsList *tmp = array[i];
                array[i] = array[i+1];
                array[i+1] = tmp;
                sorted = 0;
            } // if
        } // for
    } while (!sorted);

    // okay, sorted. While we're here, let's redo the linked list in order...
    for (i = 0; i < ctx->constant_count; i++)
        array[i]->next = array[i+1];
    ctx->constants = array[0];

    // now figure out the groupings of constants and add to ctx->variables...
    int start = -1;
    int prev = -1;
    int count = 0;
    const int hi = ctx->constant_count;
    for (i = 0; i <= hi; i++)
    {
        if (array[i] && (array[i]->constant.type != MOJOSHADER_UNIFORM_FLOAT))
            continue;  // we only care about REG_TYPE_CONST for array groups.

        if (start == -1)
        {
            prev = start = i;  // first REG_TYPE_CONST we've seen. Mark it!
            continue;
        } // if

        // not a match (or last item in the array)...see if we had a
        //  contiguous set before this point...
        if ( (array[i]) && (array[i]->constant.index == (array[prev]->constant.index + 1)) )
            count++;
        else
        {
            if (count > 0)  // multiple constants in the set?
            {
                VariableList *var;
                var = (VariableList *) Malloc(ctx, sizeof (VariableList));
                if (var == NULL)
                    break;

                var->type = MOJOSHADER_UNIFORM_FLOAT;
                var->index = array[start]->constant.index;
                var->count = (array[prev]->constant.index - var->index) + 1;
                var->constant = array[start];
                var->used = 0;
                var->emit_position = -1;
                var->next = ctx->variables;
                ctx->variables = var;
            } // else

            start = i;   // set this as new start of sequence.
        } // if

        prev = i;
    } // for
}